

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueShrinkableStorage.hpp
# Opt level: O2

KeyIndexStorage * __thiscall
supermap::
KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
::exportKeys(KeyIndexStorage *__return_storage_ptr__,
            KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
            *this,unsigned_long batchSize,string *keysFilename)

{
  pointer *__ptr;
  long *local_a8 [2];
  undefined1 local_98 [16];
  vector<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
  keys;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
  local_60;
  _Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
  local_40;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&keys,keysFilename,auto_format);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
  ::getFileManager((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
                    *)local_98);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
  ::function(&local_60,&this->innerRegisterSupplier_);
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
  ::SingleFileIndexedStorage
            (__return_storage_ptr__,(path *)&keys,(shared_ptr<supermap::io::FileManager> *)local_98,
             &local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::filesystem::__cxx11::path::~path((path *)&keys);
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
  ::
  getCustomDataIterator<supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,void>
              *)local_a8);
  io::
  InputIterator<supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,4224ul,void>
  ::
  collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>::exportKeys(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>&&,unsigned_long)_1_,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>
            (&keys,local_a8,batchSize);
  (*(__return_storage_ptr__->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
    ._vptr_Cloneable[5])
            (&(__return_storage_ptr__->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
              .register_,
             (this->sortedStorage_).
             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
             .
             super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
             .
             super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
             .register_.count_);
  while( true ) {
    if (keys.
        super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        keys.
        super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
    ::
    appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,void>
              ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>
                *)__return_storage_ptr__);
    io::
    InputIterator<supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>,unsigned_long,4224ul,void>
    ::
    collectWith<supermap::KeyValueShrinkableStorage<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>::exportKeys(unsigned_long,std::__cxx11::string_const&)::_lambda(supermap::StorageValueIgnorer<supermap::Key<128ul>,supermap::ByteArray<4096ul>>&&,unsigned_long)_2_,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>
              (&local_40,local_a8,batchSize);
    std::
    vector<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
    ::_M_move_assign(&keys,&local_40);
    std::
    _Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
    ::~_Vector_base(&local_40);
  }
  std::
  _Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
  ::~_Vector_base(&keys.
                   super__Vector_base<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
                 );
  if (local_a8[0] != (long *)0x0) {
    (**(code **)(*local_a8[0] + 0x18))();
  }
  return __return_storage_ptr__;
}

Assistant:

KeyIndexStorage exportKeys(IndexT batchSize, const std::string &keysFilename) {
        KeyIndexStorage sortedIndex(keysFilename, getFileManager(), innerRegisterSupplier_);
        auto it = sortedStorage_.template getCustomDataIterator<ValueIgnorer>();
        auto keys = it.collectWith([](ValueIgnorer &&kvi, IndexT ind) {
            return KeyIndex{std::move(kvi.key), ind};
        }, batchSize);
        sortedIndex.getRegister().reserve(sortedStorage_.getItemsCount());
        while (!keys.empty()) {
            sortedIndex.appendAll(keys.cbegin(), keys.cend());
            keys = it.collectWith([](ValueIgnorer &&kvi, IndexT ind) {
                return KeyIndex{std::move(kvi.key), ind};
            }, batchSize);
        }
        return sortedIndex;
    }